

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

Matrix * rw::Matrix::invert(Matrix *dst,Matrix *src)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float32 fVar5;
  float32 fVar6;
  float32 fVar7;
  float32 fVar8;
  float32 fVar9;
  float32 fVar10;
  float32 fVar11;
  
  if ((src->flags >> 0x11 & 1) == 0) {
    if ((~src->flags & 3) == 0) {
      invertOrthonormal(dst,src);
    }
    else {
      invertGeneral(dst,src);
    }
  }
  else {
    fVar10 = (src->right).x;
    fVar11 = (src->right).y;
    uVar1 = *(undefined8 *)&(src->right).z;
    fVar8 = (src->up).x;
    fVar9 = (src->up).y;
    uVar2 = *(undefined8 *)&(src->up).z;
    fVar6 = (src->at).x;
    fVar7 = (src->at).y;
    uVar3 = *(undefined8 *)&(src->at).z;
    fVar5 = (src->pos).y;
    uVar4 = *(undefined8 *)&(src->pos).z;
    (dst->pos).x = (src->pos).x;
    (dst->pos).y = fVar5;
    *(undefined8 *)&(dst->pos).z = uVar4;
    (dst->at).x = fVar6;
    (dst->at).y = fVar7;
    *(undefined8 *)&(dst->at).z = uVar3;
    (dst->up).x = fVar8;
    (dst->up).y = fVar9;
    *(undefined8 *)&(dst->up).z = uVar2;
    (dst->right).x = fVar10;
    (dst->right).y = fVar11;
    *(undefined8 *)&(dst->right).z = uVar1;
  }
  return dst;
}

Assistant:

Matrix*
Matrix::invert(Matrix *dst, const Matrix *src)
{
	if(src->flags & IDENTITY)
		*dst = *src;
	else if((src->flags & TYPEMASK) == TYPEORTHONORMAL)
		invertOrthonormal(dst, src);
	else
		return invertGeneral(dst, src);
	return dst;
}